

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

void fill(int64_t *dst,int size,int type)

{
  int64_t *dst_00;
  uint in_EDX;
  uint in_ESI;
  int64_t *in_RDI;
  uint i_1;
  uint i;
  int in_stack_00000028;
  int in_stack_0000002c;
  int64_t *in_stack_00000030;
  uint in_stack_ffffffffffffffdc;
  uint uVar1;
  int in_stack_ffffffffffffffe8;
  uint uVar2;
  uint in_stack_ffffffffffffffec;
  
  dst_00 = (int64_t *)(ulong)in_EDX;
  switch(dst_00) {
  case (int64_t *)0x0:
    fill_random(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x1:
    fill_dup50((int64_t *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
    break;
  case (int64_t *)0x2:
    fill_random2(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x3:
    fill_random10(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x4:
    fill_random(dst_00,in_stack_ffffffffffffffdc);
    make_mixed(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x5:
    fill_dup50((int64_t *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
    make_mixed(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x6:
    fill_random2(dst_00,in_stack_ffffffffffffffdc);
    make_mixed(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x7:
    fill_random10(dst_00,in_stack_ffffffffffffffdc);
    make_mixed(dst_00,in_stack_ffffffffffffffdc);
    break;
  case (int64_t *)0x8:
    fill_sorted(in_RDI,in_ESI);
    break;
  case (int64_t *)0x9:
    fill_sorted(in_RDI,in_ESI);
    make_disord6(in_RDI,in_ESI);
    break;
  case (int64_t *)0xa:
    fill_reverse(in_RDI,in_ESI);
    break;
  case (int64_t *)0xb:
    fill_random2(dst_00,in_stack_ffffffffffffffdc);
    qsort(in_RDI,(long)(int)in_ESI,8,simple_cmp_reverse);
    break;
  case (int64_t *)0xc:
    fill_random10(dst_00,in_stack_ffffffffffffffdc);
    qsort(in_RDI,(long)(int)in_ESI,8,simple_cmp_reverse);
    break;
  case (int64_t *)0xd:
    fill_same(in_RDI,in_ESI);
    break;
  case (int64_t *)0xe:
    fill_sorted_blocks((int64_t *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                       in_stack_ffffffffffffffe8);
    break;
  case (int64_t *)0xf:
    fill_sorted_blocks((int64_t *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                       in_stack_ffffffffffffffe8);
    break;
  case (int64_t *)0x10:
    fill_sorted_blocks((int64_t *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                       in_stack_ffffffffffffffe8);
    break;
  case (int64_t *)0x11:
    fill_swapped(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    break;
  case (int64_t *)0x12:
    fill_swapped(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    break;
  case (int64_t *)0x13:
    for (uVar2 = 0; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
      in_RDI[uVar2] = (ulong)(uVar2 ^ 1);
    }
    break;
  case (int64_t *)0x14:
    for (uVar2 = 0; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
      uVar1 = uVar2;
      if ((uVar2 & 1) == 0) {
        uVar1 = in_ESI - uVar2;
      }
      in_RDI[uVar2] = (ulong)uVar1;
    }
    break;
  default:
    abort();
  }
  return;
}

Assistant:

static void fill(int64_t *dst, const int size, int type) {
  switch (type) {
  case FILL_RANDOM:
    fill_random(dst, size);
    break;

  case FILL_RNDDUP50:
    fill_dup50(dst, size);
    break;

  case FILL_RANDOM2:
    fill_random2(dst, size);
    break;

  case FILL_RANDOM10:
    fill_random10(dst, size);
    break;

  case FILL_MIXED:
    fill_random(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXDUP50:
    fill_dup50(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXED2:
    fill_random2(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_MIXED10:
    fill_random10(dst, size);
    make_mixed(dst, size);
    break;

  case FILL_SORTED:
    fill_sorted(dst, size);
    break;

  case FILL_SORTED94:
    fill_sorted(dst, size);
    make_disord6(dst, size);
    break;

  case FILL_REVERSE:
    fill_reverse(dst, size);
    break;

  case FILL_REVERSE2:
    fill_random2(dst, size);
    qsort(dst, size, sizeof(int64_t), simple_cmp_reverse);
    break;

  case FILL_REVERSE10:
    fill_random10(dst, size);
    qsort(dst, size, sizeof(int64_t), simple_cmp_reverse);
    break;

  case FILL_ALLSAME:
    fill_same(dst, size);
    break;

  case FILL_SORTED_10:
    fill_sorted_blocks(dst, size, 10);
    break;

  case FILL_SORTED_100:
    fill_sorted_blocks(dst, size, 100);
    break;

  case FILL_SORTED_10000:
    fill_sorted_blocks(dst, size, 10000);
    break;

  case FILL_SWAPPED_N2:
    fill_swapped(dst, size, size / 2);
    break;

  case FILL_SWAPPED_N8:
    fill_swapped(dst, size, size / 8);
    break;

  case FILL_EVIL1:
    for (unsigned i = 0; i < size; i++)
      dst[i] = i ^ 1;
    break;

  case FILL_EVIL2:
    for (unsigned i = 0; i < size; i++)
      dst[i] = (i & 1) ? i : size - i;
    break;

  default:
    abort();
  }
}